

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this,void **vtt)

{
  void **vtt_local;
  IfcProcess *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcess,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcess,_0UL> *)
             &(this->super_IfcObject).field_0xd0,vtt + 0x10);
  IfcObject::~IfcObject(&this->super_IfcObject,vtt + 1);
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}